

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinylogger.h
# Opt level: O3

string * __thiscall
tlog::durationToString<std::chrono::duration<double,std::ratio<1l,1000000l>>>
          (string *__return_storage_ptr__,tlog *this,duration<double,_std::ratio<1L,_1000000L>_> dur
          )

{
  bool bVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  uint uVar5;
  long *plVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  ulong uVar9;
  size_type *psVar10;
  uint uVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  string *psVar16;
  ulong __val;
  double dVar17;
  string __str_3;
  string __str_1;
  string __str;
  string __str_5;
  string __str_4;
  string __str_2;
  ulong *local_238;
  ulong local_230;
  ulong local_228;
  undefined8 uStack_220;
  ulong *local_218;
  ulong local_210;
  ulong local_208;
  long lStack_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8;
  long lStack_1e0;
  ulong *local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  undefined8 uStack_1c0;
  string *local_1b8;
  ulong *local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  long lStack_198;
  ulong *local_190;
  ulong local_188;
  ulong local_180;
  undefined8 uStack_178;
  ulong *local_170;
  ulong local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  long lStack_158;
  ulong *local_150;
  ulong local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  undefined8 uStack_138;
  ulong *local_130;
  ulong local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  undefined8 uStack_118;
  ulong *local_110;
  ulong local_108;
  ulong local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  ulong local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  long lStack_d8;
  ulong *local_d0;
  ulong local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  ulong *local_b0;
  ulong local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  ulong *local_90;
  ulong local_88;
  ulong local_80;
  undefined8 uStack_78;
  ulong *local_70;
  ulong local_68;
  ulong local_60;
  undefined8 uStack_58;
  ulong *local_50;
  ulong local_48;
  ulong local_40;
  undefined8 uStack_38;
  
  uVar14 = (ulong)(dur.__r / 86400000000.0);
  dVar17 = dur.__r - (double)(long)uVar14 * 86400000000.0;
  uVar13 = (ulong)(dVar17 / 3600000000.0);
  dVar17 = dVar17 - (double)(long)uVar13 * 3600000000.0;
  __val = (ulong)(dVar17 / 60000000.0);
  uVar15 = (ulong)((dVar17 - (double)(long)__val * 60000000.0) / 1000000.0);
  lVar4 = (long)uVar15 >> 0x3f;
  cVar2 = (char)((long)__val >> 0x3f);
  cVar3 = (char)((long)uVar15 >> 0x3f);
  local_1b8 = __return_storage_ptr__;
  if ((long)uVar14 < 1) {
    if ((long)uVar13 < 1) {
      if ((long)__val < 1) {
        uVar13 = -uVar15;
        if (0 < (long)uVar15) {
          uVar13 = uVar15;
        }
        uVar11 = 1;
        if (9 < uVar13) {
          uVar14 = uVar13;
          uVar5 = 4;
          do {
            uVar11 = uVar5;
            if (uVar14 < 100) {
              uVar11 = uVar11 - 2;
              goto LAB_0010a0af;
            }
            if (uVar14 < 1000) {
              uVar11 = uVar11 - 1;
              goto LAB_0010a0af;
            }
            if (uVar14 < 10000) goto LAB_0010a0af;
            bVar1 = 99999 < uVar14;
            uVar14 = uVar14 / 10000;
            uVar5 = uVar11 + 4;
          } while (bVar1);
          uVar11 = uVar11 + 1;
        }
LAB_0010a0af:
        puVar8 = &local_228;
        local_238 = puVar8;
        std::__cxx11::string::_M_construct((ulong)&local_238,(char)uVar11 - cVar3);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)((long)local_238 - lVar4),uVar11,uVar13);
        plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_238,local_230,0,'\x01');
        (local_1b8->_M_dataplus)._M_p = (pointer)&local_1b8->field_2;
        psVar10 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar10) {
          lVar4 = plVar6[3];
          (local_1b8->field_2)._M_allocated_capacity = *psVar10;
          *(long *)((long)&local_1b8->field_2 + 8) = lVar4;
        }
        else {
          (local_1b8->_M_dataplus)._M_p = (pointer)*plVar6;
          (local_1b8->field_2)._M_allocated_capacity = *psVar10;
        }
        local_1b8->_M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        puVar12 = local_238;
        psVar16 = local_1b8;
      }
      else {
        uVar11 = 1;
        if (9 < __val) {
          uVar13 = __val;
          uVar5 = 4;
          do {
            uVar11 = uVar5;
            if (uVar13 < 100) {
              uVar11 = uVar11 - 2;
              goto LAB_00109da5;
            }
            if (uVar13 < 1000) {
              uVar11 = uVar11 - 1;
              goto LAB_00109da5;
            }
            if (uVar13 < 10000) goto LAB_00109da5;
            bVar1 = 99999 < uVar13;
            uVar13 = uVar13 / 10000;
            uVar5 = uVar11 + 4;
          } while (bVar1);
          uVar11 = uVar11 + 1;
        }
LAB_00109da5:
        puVar8 = &local_1c8;
        local_1d8 = puVar8;
        std::__cxx11::string::_M_construct((ulong)&local_1d8,(char)uVar11);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1d8,uVar11,__val);
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_replace_aux((ulong)&local_1d8,local_1d0,0,'\x01');
        puVar12 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar12) {
          local_1e8 = *puVar12;
          lStack_1e0 = puVar7[3];
          local_1f8 = &local_1e8;
        }
        else {
          local_1e8 = *puVar12;
          local_1f8 = (ulong *)*puVar7;
        }
        local_1f0 = puVar7[1];
        *puVar7 = puVar12;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        uVar13 = -uVar15;
        if (0 < (long)uVar15) {
          uVar13 = uVar15;
        }
        uVar11 = 1;
        if (9 < uVar13) {
          uVar14 = uVar13;
          uVar5 = 4;
          do {
            uVar11 = uVar5;
            if (uVar14 < 100) {
              uVar11 = uVar11 - 2;
              goto LAB_00109e99;
            }
            if (uVar14 < 1000) {
              uVar11 = uVar11 - 1;
              goto LAB_00109e99;
            }
            if (uVar14 < 10000) goto LAB_00109e99;
            bVar1 = 99999 < uVar14;
            uVar14 = uVar14 / 10000;
            uVar5 = uVar11 + 4;
          } while (bVar1);
          uVar11 = uVar11 + 1;
        }
LAB_00109e99:
        local_f0 = (ulong *)&local_e0;
        std::__cxx11::string::_M_construct((ulong)&local_f0,(char)uVar11 - cVar3);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)((long)local_f0 - lVar4),uVar11,uVar13);
        if (local_e8 < 2) {
          std::__cxx11::string::insert((ulong)&local_f0,0,'\x02' - (char)local_e8);
        }
        uVar13 = local_e8;
        psVar16 = local_1b8;
        if (local_f0 == (ulong *)&local_e0) {
          lStack_200 = lStack_d8;
          local_f0 = &local_208;
        }
        local_208 = CONCAT71(uStack_df,local_e0);
        local_210 = local_e8;
        local_e8 = 0;
        local_e0 = 0;
        uVar14 = 0xf;
        if (local_1f8 != &local_1e8) {
          uVar14 = local_1e8;
        }
        local_218 = local_f0;
        if (uVar14 < local_1f0 + uVar13) {
          uVar14 = 0xf;
          if (local_f0 != &local_208) {
            uVar14 = local_208;
          }
          if (uVar14 < local_1f0 + uVar13) goto LAB_00109f9d;
          local_f0 = (ulong *)&local_e0;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_1f8);
        }
        else {
LAB_00109f9d:
          puVar12 = local_f0;
          local_f0 = (ulong *)&local_e0;
          puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)puVar12);
        }
        local_238 = &local_228;
        puVar12 = puVar7 + 2;
        if ((ulong *)*puVar7 == puVar12) {
          local_228 = *puVar12;
          uStack_220 = puVar7[3];
        }
        else {
          local_228 = *puVar12;
          local_238 = (ulong *)*puVar7;
        }
        local_230 = puVar7[1];
        *puVar7 = puVar12;
        puVar7[1] = 0;
        *(undefined1 *)puVar12 = 0;
        plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_238,local_230,0,'\x01');
        (psVar16->_M_dataplus)._M_p = (pointer)&psVar16->field_2;
        psVar10 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar10) {
          lVar4 = plVar6[3];
          (psVar16->field_2)._M_allocated_capacity = *psVar10;
          *(long *)((long)&psVar16->field_2 + 8) = lVar4;
        }
        else {
          (psVar16->_M_dataplus)._M_p = (pointer)*plVar6;
          (psVar16->field_2)._M_allocated_capacity = *psVar10;
        }
        psVar16->_M_string_length = plVar6[1];
        *plVar6 = (long)psVar10;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if (local_238 != &local_228) {
          operator_delete(local_238);
        }
        if (local_218 != &local_208) {
          operator_delete(local_218);
        }
        if (local_f0 != (ulong *)&local_e0) {
          operator_delete(local_f0);
        }
        puVar12 = local_1d8;
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8);
          puVar12 = local_1d8;
        }
      }
      if (puVar12 == puVar8) {
        return psVar16;
      }
      goto LAB_00109d84;
    }
    uVar11 = 1;
    if (9 < uVar13) {
      uVar14 = uVar13;
      uVar5 = 4;
      do {
        uVar11 = uVar5;
        if (uVar14 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_001097c5;
        }
        if (uVar14 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_001097c5;
        }
        if (uVar14 < 10000) goto LAB_001097c5;
        bVar1 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        uVar5 = uVar11 + 4;
      } while (bVar1);
      uVar11 = uVar11 + 1;
    }
LAB_001097c5:
    local_190 = &local_180;
    std::__cxx11::string::_M_construct((ulong)&local_190,(char)uVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_190,uVar11,uVar13);
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_replace_aux((ulong)&local_190,local_188,0,'\x01');
    puVar8 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar8) {
      local_208 = *puVar8;
      lStack_200 = puVar7[3];
      local_218 = &local_208;
    }
    else {
      local_208 = *puVar8;
      local_218 = (ulong *)*puVar7;
    }
    local_210 = puVar7[1];
    *puVar7 = puVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    uVar13 = -__val;
    if (0 < (long)__val) {
      uVar13 = __val;
    }
    uVar11 = 1;
    if (9 < uVar13) {
      uVar14 = uVar13;
      uVar5 = 4;
      do {
        uVar11 = uVar5;
        if (uVar14 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_001098bf;
        }
        if (uVar14 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_001098bf;
        }
        if (uVar14 < 10000) goto LAB_001098bf;
        bVar1 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        uVar5 = uVar11 + 4;
      } while (bVar1);
      uVar11 = uVar11 + 1;
    }
LAB_001098bf:
    local_170 = (ulong *)&local_160;
    std::__cxx11::string::_M_construct((ulong)&local_170,(char)uVar11 - cVar2);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_170 - ((long)__val >> 0x3f)),uVar11,uVar13);
    if (local_168 < 2) {
      std::__cxx11::string::insert((ulong)&local_170,0,'\x02' - (char)local_168);
    }
    uVar13 = local_168;
    if (local_170 == (ulong *)&local_160) {
      lStack_198 = lStack_158;
      local_170 = &local_1a0;
    }
    local_1a0 = CONCAT71(uStack_15f,local_160);
    local_1a8 = local_168;
    local_168 = 0;
    local_160 = 0;
    uVar14 = 0xf;
    if (local_218 != &local_208) {
      uVar14 = local_208;
    }
    local_1b0 = local_170;
    if (uVar14 < local_210 + uVar13) {
      uVar14 = 0xf;
      if (local_170 != &local_1a0) {
        uVar14 = local_1a0;
      }
      if (uVar14 < local_210 + uVar13) goto LAB_001099d1;
      local_170 = (ulong *)&local_160;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_218);
    }
    else {
LAB_001099d1:
      puVar8 = local_170;
      local_170 = (ulong *)&local_160;
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)puVar8);
    }
    local_1d8 = &local_1c8;
    puVar8 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar8) {
      local_1c8 = *puVar8;
      uStack_1c0 = puVar7[3];
    }
    else {
      local_1c8 = *puVar8;
      local_1d8 = (ulong *)*puVar7;
    }
    local_1d0 = puVar7[1];
    *puVar7 = puVar8;
    puVar7[1] = 0;
    *(undefined1 *)puVar8 = 0;
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_replace_aux((ulong)&local_1d8,local_1d0,0,'\x01');
    puVar8 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar8) {
      local_1e8 = *puVar8;
      lStack_1e0 = puVar7[3];
      local_1f8 = &local_1e8;
    }
    else {
      local_1e8 = *puVar8;
      local_1f8 = (ulong *)*puVar7;
    }
    local_1f0 = puVar7[1];
    *puVar7 = puVar8;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    uVar13 = -uVar15;
    if (0 < (long)uVar15) {
      uVar13 = uVar15;
    }
    uVar11 = 1;
    if (9 < uVar13) {
      uVar14 = uVar13;
      uVar5 = 4;
      do {
        uVar11 = uVar5;
        if (uVar14 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00109b03;
        }
        if (uVar14 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00109b03;
        }
        if (uVar14 < 10000) goto LAB_00109b03;
        bVar1 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        uVar5 = uVar11 + 4;
      } while (bVar1);
      uVar11 = uVar11 + 1;
    }
LAB_00109b03:
    local_d0 = (ulong *)&local_c0;
    std::__cxx11::string::_M_construct((ulong)&local_d0,(char)uVar11 - cVar3);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)((long)local_d0 - lVar4),uVar11,uVar13)
    ;
    if (local_c8 < 2) {
      std::__cxx11::string::insert((ulong)&local_d0,0,'\x02' - (char)local_c8);
    }
    uVar13 = local_c8;
    psVar16 = local_1b8;
    if (local_d0 == (ulong *)&local_c0) {
      uStack_f8 = uStack_b8;
      local_d0 = &local_100;
    }
    local_100 = CONCAT71(uStack_bf,local_c0);
    local_108 = local_c8;
    local_c8 = 0;
    local_c0 = 0;
    uVar14 = 0xf;
    if (local_1f8 != &local_1e8) {
      uVar14 = local_1e8;
    }
    local_110 = local_d0;
    if (uVar14 < local_1f0 + uVar13) {
      uVar14 = 0xf;
      if (local_d0 != &local_100) {
        uVar14 = local_100;
      }
      if (uVar14 < local_1f0 + uVar13) goto LAB_00109c17;
      local_d0 = (ulong *)&local_c0;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_1f8);
    }
    else {
LAB_00109c17:
      puVar8 = local_d0;
      local_d0 = (ulong *)&local_c0;
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)puVar8);
    }
    local_238 = &local_228;
    puVar8 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar8) {
      local_228 = *puVar8;
      uStack_220 = puVar7[3];
    }
    else {
      local_228 = *puVar8;
      local_238 = (ulong *)*puVar7;
    }
    local_230 = puVar7[1];
    *puVar7 = puVar8;
    puVar7[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_238,local_230,0,'\x01');
    (psVar16->_M_dataplus)._M_p = (pointer)&psVar16->field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar10) {
      lVar4 = plVar6[3];
      (psVar16->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&psVar16->field_2 + 8) = lVar4;
    }
    else {
      (psVar16->_M_dataplus)._M_p = (pointer)*plVar6;
      (psVar16->field_2)._M_allocated_capacity = *psVar10;
    }
    psVar16->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_238 != &local_228) {
      operator_delete(local_238);
    }
    if (local_110 != &local_100) {
      operator_delete(local_110);
    }
    if (local_d0 != (ulong *)&local_c0) {
      operator_delete(local_d0);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    if (local_170 != (ulong *)&local_160) {
      operator_delete(local_170);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218);
    }
    puVar8 = &local_180;
    puVar12 = local_190;
  }
  else {
    uVar11 = 1;
    if (9 < uVar14) {
      uVar9 = uVar14;
      uVar5 = 4;
      do {
        uVar11 = uVar5;
        if (uVar9 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00108ec2;
        }
        if (uVar9 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00108ec2;
        }
        if (uVar9 < 10000) goto LAB_00108ec2;
        bVar1 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        uVar5 = uVar11 + 4;
      } while (bVar1);
      uVar11 = uVar11 + 1;
    }
LAB_00108ec2:
    local_110 = &local_100;
    std::__cxx11::string::_M_construct((ulong)&local_110,(char)uVar11);
    std::__detail::__to_chars_10_impl<unsigned_long_long>((char *)local_110,uVar11,uVar14);
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_110,local_108,0,'\x01');
    puVar8 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar8) {
      local_1a0 = *puVar8;
      lStack_198 = plVar6[3];
      local_1b0 = &local_1a0;
    }
    else {
      local_1a0 = *puVar8;
      local_1b0 = (ulong *)*plVar6;
    }
    local_1a8 = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    uVar14 = -uVar13;
    if (0 < (long)uVar13) {
      uVar14 = uVar13;
    }
    uVar11 = 1;
    if (9 < uVar14) {
      uVar9 = uVar14;
      uVar5 = 4;
      do {
        uVar11 = uVar5;
        if (uVar9 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00108fc2;
        }
        if (uVar9 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00108fc2;
        }
        if (uVar9 < 10000) goto LAB_00108fc2;
        bVar1 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        uVar5 = uVar11 + 4;
      } while (bVar1);
      uVar11 = uVar11 + 1;
    }
LAB_00108fc2:
    local_130 = (ulong *)&local_120;
    std::__cxx11::string::_M_construct
              ((ulong)&local_130,(char)uVar11 - (char)((long)uVar13 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_130 - ((long)uVar13 >> 0x3f)),uVar11,uVar14);
    if (local_128 < 2) {
      std::__cxx11::string::insert((ulong)&local_130,0,'\x02' - (char)local_128);
    }
    uVar13 = local_128;
    if (local_130 == (ulong *)&local_120) {
      uStack_78 = uStack_118;
      local_130 = &local_80;
    }
    local_80 = CONCAT71(uStack_11f,local_120);
    local_88 = local_128;
    local_128 = 0;
    local_120 = 0;
    uVar14 = 0xf;
    if (local_1b0 != &local_1a0) {
      uVar14 = local_1a0;
    }
    local_90 = local_130;
    if (uVar14 < local_1a8 + uVar13) {
      uVar14 = 0xf;
      if (local_130 != &local_80) {
        uVar14 = local_80;
      }
      if (uVar14 < local_1a8 + uVar13) goto LAB_001090dc;
      local_130 = (ulong *)&local_120;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_1b0);
    }
    else {
LAB_001090dc:
      local_130 = (ulong *)&local_120;
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_90);
    }
    local_190 = &local_180;
    puVar8 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar8) {
      local_180 = *puVar8;
      uStack_178 = puVar7[3];
    }
    else {
      local_180 = *puVar8;
      local_190 = (ulong *)*puVar7;
    }
    local_188 = puVar7[1];
    *puVar7 = puVar8;
    puVar7[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_190,local_188,0,'\x01');
    puVar8 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar8) {
      local_208 = *puVar8;
      lStack_200 = plVar6[3];
      local_218 = &local_208;
    }
    else {
      local_208 = *puVar8;
      local_218 = (ulong *)*plVar6;
    }
    local_210 = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    uVar13 = -__val;
    if (0 < (long)__val) {
      uVar13 = __val;
    }
    uVar11 = 1;
    if (9 < uVar13) {
      uVar14 = uVar13;
      uVar5 = 4;
      do {
        uVar11 = uVar5;
        if (uVar14 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00109221;
        }
        if (uVar14 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00109221;
        }
        if (uVar14 < 10000) goto LAB_00109221;
        bVar1 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        uVar5 = uVar11 + 4;
      } while (bVar1);
      uVar11 = uVar11 + 1;
    }
LAB_00109221:
    local_150 = (ulong *)&local_140;
    std::__cxx11::string::_M_construct((ulong)&local_150,(char)uVar11 - cVar2);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_150 - ((long)__val >> 0x3f)),uVar11,uVar13);
    if (local_148 < 2) {
      std::__cxx11::string::insert((ulong)&local_150,0,'\x02' - (char)local_148);
    }
    uVar13 = local_148;
    if (local_150 == (ulong *)&local_140) {
      uStack_38 = uStack_138;
      local_150 = &local_40;
    }
    local_40 = CONCAT71(uStack_13f,local_140);
    local_48 = local_148;
    local_148 = 0;
    local_140 = 0;
    uVar14 = 0xf;
    if (local_218 != &local_208) {
      uVar14 = local_208;
    }
    local_50 = local_150;
    if (uVar14 < local_210 + uVar13) {
      uVar14 = 0xf;
      if (local_150 != &local_40) {
        uVar14 = local_40;
      }
      if (uVar14 < local_210 + uVar13) goto LAB_00109332;
      local_150 = (ulong *)&local_140;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_218);
    }
    else {
LAB_00109332:
      local_150 = (ulong *)&local_140;
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_50);
    }
    local_1d8 = &local_1c8;
    puVar8 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar8) {
      local_1c8 = *puVar8;
      uStack_1c0 = puVar7[3];
    }
    else {
      local_1c8 = *puVar8;
      local_1d8 = (ulong *)*puVar7;
    }
    local_1d0 = puVar7[1];
    *puVar7 = puVar8;
    puVar7[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_1d8,local_1d0,0,'\x01');
    puVar8 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar8) {
      local_1e8 = *puVar8;
      lStack_1e0 = plVar6[3];
      local_1f8 = &local_1e8;
    }
    else {
      local_1e8 = *puVar8;
      local_1f8 = (ulong *)*plVar6;
    }
    local_1f0 = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    uVar13 = -uVar15;
    if (0 < (long)uVar15) {
      uVar13 = uVar15;
    }
    uVar11 = 1;
    if (9 < uVar13) {
      uVar14 = uVar13;
      uVar5 = 4;
      do {
        uVar11 = uVar5;
        if (uVar14 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00109465;
        }
        if (uVar14 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00109465;
        }
        if (uVar14 < 10000) goto LAB_00109465;
        bVar1 = 99999 < uVar14;
        uVar14 = uVar14 / 10000;
        uVar5 = uVar11 + 4;
      } while (bVar1);
      uVar11 = uVar11 + 1;
    }
LAB_00109465:
    local_b0 = (ulong *)&local_a0;
    std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar11 - cVar3);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)((long)local_b0 - lVar4),uVar11,uVar13)
    ;
    if (local_a8 < 2) {
      std::__cxx11::string::insert((ulong)&local_b0,0,'\x02' - (char)local_a8);
    }
    uVar13 = local_a8;
    psVar16 = local_1b8;
    if (local_b0 == (ulong *)&local_a0) {
      uStack_58 = uStack_98;
      local_b0 = &local_60;
    }
    local_60 = CONCAT71(uStack_9f,local_a0);
    local_68 = local_a8;
    local_a8 = 0;
    local_a0 = 0;
    uVar14 = 0xf;
    if (local_1f8 != &local_1e8) {
      uVar14 = local_1e8;
    }
    local_70 = local_b0;
    if (uVar14 < local_1f0 + uVar13) {
      uVar14 = 0xf;
      if (local_b0 != &local_60) {
        uVar14 = local_60;
      }
      if (uVar14 < local_1f0 + uVar13) goto LAB_00109579;
      local_b0 = (ulong *)&local_a0;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_1f8);
    }
    else {
LAB_00109579:
      local_b0 = (ulong *)&local_a0;
      puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_70);
    }
    local_238 = &local_228;
    puVar8 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar8) {
      local_228 = *puVar8;
      uStack_220 = puVar7[3];
    }
    else {
      local_228 = *puVar8;
      local_238 = (ulong *)*puVar7;
    }
    local_230 = puVar7[1];
    *puVar7 = puVar8;
    puVar7[1] = 0;
    *(undefined1 *)puVar8 = 0;
    plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_238,local_230,0,'\x01');
    (psVar16->_M_dataplus)._M_p = (pointer)&psVar16->field_2;
    psVar10 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar10) {
      lVar4 = plVar6[3];
      (psVar16->field_2)._M_allocated_capacity = *psVar10;
      *(long *)((long)&psVar16->field_2 + 8) = lVar4;
    }
    else {
      (psVar16->_M_dataplus)._M_p = (pointer)*plVar6;
      (psVar16->field_2)._M_allocated_capacity = *psVar10;
    }
    psVar16->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_238 != &local_228) {
      operator_delete(local_238);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_b0 != (ulong *)&local_a0) {
      operator_delete(local_b0);
    }
    if (local_1f8 != &local_1e8) {
      operator_delete(local_1f8);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50);
    }
    if (local_150 != (ulong *)&local_140) {
      operator_delete(local_150);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_130 != (ulong *)&local_120) {
      operator_delete(local_130);
    }
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0);
    }
    puVar8 = &local_100;
    puVar12 = local_110;
  }
  if (puVar12 == puVar8) {
    return psVar16;
  }
LAB_00109d84:
  operator_delete(puVar12);
  return psVar16;
}

Assistant:

std::string durationToString(T dur) {
        using namespace std::chrono;
        using day_t = duration<long long, std::ratio<3600 * 24>>;

        auto d = duration_cast<day_t>(dur);
        auto h = duration_cast<hours>(dur -= d);
        auto m = duration_cast<minutes>(dur -= h);
        auto s = duration_cast<seconds>(dur -= m);

        if (d.count() > 0) {
            return
                std::to_string(d.count()) + 'd' +
                padFromLeft(std::to_string(h.count()), 2, '0') + 'h' +
                padFromLeft(std::to_string(m.count()), 2, '0') + 'm' +
                padFromLeft(std::to_string(s.count()), 2, '0') + 's';
        } else if (h.count() > 0) {
            return
                std::to_string(h.count()) + 'h' +
                padFromLeft(std::to_string(m.count()), 2, '0') + 'm' +
                padFromLeft(std::to_string(s.count()), 2, '0') + 's';
        } else if (m.count() > 0) {
            return
                std::to_string(m.count()) + 'm' +
                padFromLeft(std::to_string(s.count()), 2, '0') + 's';
        } else {
            return std::to_string(s.count()) + 's';
        }
    }